

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O0

void capnp::_::
     checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<bool> expected)

{
  bool bVar1;
  bool b;
  uint uVar2;
  size_type sVar3;
  const_iterator pbVar4;
  uint local_40;
  uint i;
  uint local_2c;
  size_type local_28;
  Fault local_20;
  Fault f;
  initializer_list<bool> expected_local;
  
  f.exception = (Exception *)expected._M_array;
  sVar3 = std::initializer_list<bool>::size((initializer_list<bool> *)&f);
  uVar2 = List<bool,_(capnp::Kind)0>::Builder::size(&reader);
  if (sVar3 == uVar2) {
    local_40 = 0;
    while( true ) {
      sVar3 = std::initializer_list<bool>::size((initializer_list<bool> *)&f);
      if (sVar3 <= local_40) break;
      pbVar4 = std::initializer_list<bool>::begin((initializer_list<bool> *)&f);
      bVar1 = pbVar4[local_40];
      b = List<bool,_(capnp::Kind)0>::Builder::operator[](&reader,local_40);
      checkElement<bool>((bool)(bVar1 & 1),b);
      local_40 = local_40 + 1;
    }
    return;
  }
  local_28 = std::initializer_list<bool>::size((initializer_list<bool> *)&f);
  local_2c = List<bool,_(capnp::Kind)0>::Builder::size(&reader);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())","expected.size(), reader.size()",
             &local_28,&local_2c);
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}